

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O1

PaError Pa_CloseStream(PaStream *stream)

{
  undefined8 *puVar1;
  int iVar2;
  PaError PVar3;
  PaUtilStreamRepresentation **ppPVar4;
  PaUtilStreamRepresentation *pPVar5;
  PaUtilStreamRepresentation *pPVar6;
  
  if (initializationCount_ == 0) {
    iVar2 = -10000;
  }
  else if (stream == (PaStream *)0x0) {
    iVar2 = -0x2704;
  }
  else {
    iVar2 = -0x2704;
    if (*stream == 0x18273645) {
      iVar2 = 0;
    }
  }
  ppPVar4 = &firstOpenStream_;
  if (firstOpenStream_ != (PaUtilStreamRepresentation *)0x0) {
    pPVar5 = firstOpenStream_;
    if (firstOpenStream_ == (PaUtilStreamRepresentation *)stream) {
      pPVar6 = (PaUtilStreamRepresentation *)0x0;
    }
    else {
      do {
        pPVar6 = pPVar5;
        pPVar5 = pPVar6->nextOpenStream;
        if (pPVar5 == (PaUtilStreamRepresentation *)0x0) goto LAB_0010a686;
      } while (pPVar5 != (PaUtilStreamRepresentation *)stream);
    }
    if (pPVar6 != (PaUtilStreamRepresentation *)0x0) {
      ppPVar4 = &pPVar6->nextOpenStream;
    }
    *ppPVar4 = pPVar5->nextOpenStream;
  }
LAB_0010a686:
  if (iVar2 == 0) {
    puVar1 = *(undefined8 **)((long)stream + 0x10);
    iVar2 = (*(code *)puVar1[4])(stream);
    if (iVar2 == 1) {
      iVar2 = 0;
    }
    else if (iVar2 == 0) {
      iVar2 = (*(code *)puVar1[3])(stream);
    }
    if (iVar2 == 0) {
      PVar3 = (*(code *)*puVar1)(stream);
      return PVar3;
    }
  }
  return iVar2;
}

Assistant:

PaError Pa_CloseStream( PaStream* stream )
{
    PaUtilStreamInterface *interface;
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_CloseStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    /* always remove the open stream from our list, even if this function
        eventually returns an error. Otherwise CloseOpenStreams() will
        get stuck in an infinite loop */
    RemoveOpenStream( stream ); /* be sure to call this _before_ closing the stream */

    if( result == paNoError )
    {
        interface = PA_STREAM_INTERFACE(stream);

        /* abort the stream if it isn't stopped */
        result = interface->IsStopped( stream );
        if( result == 1 )
            result = paNoError;
        else if( result == 0 )
            result = interface->Abort( stream );

        if( result == paNoError )                 /** @todo REVIEW: shouldn't we close anyway? see: http://www.portaudio.com/trac/ticket/115 */
            result = interface->Close( stream );
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_CloseStream", result );

    return result;
}